

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

void __thiscall MakefileGenerator::filterIncludedFiles(MakefileGenerator *this,char *var)

{
  QMakeProject *this_00;
  long lVar1;
  bool bVar2;
  QList<ProString> *this_01;
  iterator aend;
  iterator iVar3;
  long lVar4;
  ProString *pPVar5;
  long lVar6;
  ProString *input;
  ProString *pPVar7;
  const_iterator abegin;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70 [2];
  anon_class_8_1_8991fb9c_for__M_pred local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->project;
  ProKey::ProKey((ProKey *)local_70,var);
  this_01 = &QMakeEvaluator::valuesRef(&this_00->super_QMakeEvaluator,(ProKey *)local_70)->
             super_QList<ProString>;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_70);
  pPVar7 = (this_01->d).ptr;
  lVar1 = (this_01->d).size;
  lVar6 = lVar1 * 0x30;
  input = pPVar7;
  local_70[0].d = (Data *)this;
  local_40.this = this;
  for (lVar4 = lVar1 >> 2; pPVar5 = input, 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/qmake/generators/makefile.cpp:940:23)>
            ::anon_class_8_1_8991fb9c_for__M_pred::operator()
                      ((anon_class_8_1_8991fb9c_for__M_pred *)local_70,input);
    if (bVar2) goto LAB_0014611a;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/qmake/generators/makefile.cpp:940:23)>
            ::anon_class_8_1_8991fb9c_for__M_pred::operator()
                      ((anon_class_8_1_8991fb9c_for__M_pred *)local_70,input + 1);
    pPVar5 = input + 1;
    if (bVar2) goto LAB_0014611a;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/qmake/generators/makefile.cpp:940:23)>
            ::anon_class_8_1_8991fb9c_for__M_pred::operator()
                      ((anon_class_8_1_8991fb9c_for__M_pred *)local_70,input + 2);
    pPVar5 = input + 2;
    if (bVar2) goto LAB_0014611a;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/qmake/generators/makefile.cpp:940:23)>
            ::anon_class_8_1_8991fb9c_for__M_pred::operator()
                      ((anon_class_8_1_8991fb9c_for__M_pred *)local_70,input + 3);
    pPVar5 = input + 3;
    if (bVar2) goto LAB_0014611a;
    input = input + 4;
    lVar6 = lVar6 + -0xc0;
  }
  lVar6 = lVar6 / 0x30;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      pPVar5 = pPVar7 + lVar1;
      if ((lVar6 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/qmake/generators/makefile.cpp:940:23)>
                  ::anon_class_8_1_8991fb9c_for__M_pred::operator()
                            ((anon_class_8_1_8991fb9c_for__M_pred *)local_70,input), pPVar5 = input,
         bVar2)) goto LAB_0014611a;
      pPVar5 = input + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/qmake/generators/makefile.cpp:940:23)>
            ::anon_class_8_1_8991fb9c_for__M_pred::operator()
                      ((anon_class_8_1_8991fb9c_for__M_pred *)local_70,pPVar5);
    if (bVar2) goto LAB_0014611a;
    input = pPVar5 + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/qmake/generators/makefile.cpp:940:23)>
          ::anon_class_8_1_8991fb9c_for__M_pred::operator()
                    ((anon_class_8_1_8991fb9c_for__M_pred *)local_70,input);
  pPVar5 = pPVar7 + lVar1;
  if (bVar2) {
    pPVar5 = input;
  }
LAB_0014611a:
  if (((long)pPVar5 - (long)pPVar7) / 0x30 != (this_01->d).size) {
    aend = QList<ProString>::end(this_01);
    iVar3 = QList<ProString>::begin(this_01);
    pPVar7 = iVar3.i + ((long)pPVar5 - (long)pPVar7);
    abegin.i = pPVar7;
    while (pPVar7 = pPVar7 + 1, pPVar7 != aend.i) {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/qmake/generators/makefile.cpp:940:23)>
              ::anon_class_8_1_8991fb9c_for__M_pred::operator()(&local_40,pPVar7);
      if (!bVar2) {
        ProString::operator=(abegin.i,pPVar7);
        abegin.i = abegin.i + 1;
      }
    }
    QList<ProString>::erase(this_01,abegin,(const_iterator)aend.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
MakefileGenerator::filterIncludedFiles(const char *var)
{
    ProStringList &inputs = project->values(var);
    auto isIncluded = [this](const ProString &input) {
        return QMakeSourceFileInfo::included(input.toQString()) > 0;
    };
    inputs.removeIf(isIncluded);
}